

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Skip(TestInfo *this)

{
  int a_line_number;
  UnitTest *pUVar1;
  TestEventListeners *this_00;
  char *a_file_name;
  UnitTestImpl *this_01;
  TestPartResultReporterInterface *pTVar2;
  undefined1 local_88 [8];
  TestPartResult test_part_result;
  TestEventListener *repeater;
  TestInfo *this_local;
  
  if ((this->should_run_ & 1U) != 0) {
    pUVar1 = UnitTest::GetInstance();
    UnitTest::set_current_test_info(pUVar1,this);
    pUVar1 = UnitTest::GetInstance();
    this_00 = UnitTest::listeners(pUVar1);
    test_part_result.message_.field_2._8_8_ = TestEventListeners::repeater(this_00);
    (*((TestEventListener *)test_part_result.message_.field_2._8_8_)->_vptr_TestEventListener[8])
              (test_part_result.message_.field_2._8_8_,this);
    a_file_name = file(this);
    a_line_number = line(this);
    TestPartResult::TestPartResult((TestPartResult *)local_88,kSkip,a_file_name,a_line_number,"");
    this_01 = internal::GetUnitTestImpl();
    pTVar2 = internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread(this_01);
    (*pTVar2->_vptr_TestPartResultReporterInterface[2])(pTVar2,local_88);
    (**(code **)(*(long *)test_part_result.message_.field_2._8_8_ + 0x58))
              (test_part_result.message_.field_2._8_8_,this);
    pUVar1 = UnitTest::GetInstance();
    UnitTest::set_current_test_info(pUVar1,(TestInfo *)0x0);
    TestPartResult::~TestPartResult((TestPartResult *)local_88);
  }
  return;
}

Assistant:

void TestInfo::Skip() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TestPartResult test_part_result =
      TestPartResult(TestPartResult::kSkip, this->file(), this->line(), "");
  internal::GetUnitTestImpl()
      ->GetTestPartResultReporterForCurrentThread()
      ->ReportTestPartResult(test_part_result);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);
  UnitTest::GetInstance()->set_current_test_info(nullptr);
}